

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

void ps_astar_finish(ps_astar_t *nbest)

{
  glist_t pgVar1;
  glist_t *ppgVar2;
  
  ppgVar2 = &nbest->hyps;
  while (pgVar1 = *ppgVar2, pgVar1 != (glist_t)0x0) {
    ckd_free((pgVar1->data).ptr);
    ppgVar2 = &pgVar1->next;
  }
  glist_free(nbest->hyps);
  listelem_alloc_free(nbest->latpath_alloc);
  ckd_free(nbest);
  return;
}

Assistant:

void
ps_astar_finish(ps_astar_t *nbest)
{
    gnode_t *gn;

    /* Free all hyps. */
    for (gn = nbest->hyps; gn; gn = gnode_next(gn)) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(nbest->hyps);
    /* Free all paths. */
    listelem_alloc_free(nbest->latpath_alloc);
    /* Free the Henge. */
    ckd_free(nbest);
}